

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O1

void __thiscall
Imf_3_4::InputFile::Data::copyCachedBuffer
          (Data *this,ConstIterator to,ConstIterator from,int scanline1,int scanline2,int yStart,
          int xStart,int width)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ArgExc *this_00;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined4 *puVar10;
  long lVar11;
  long lVar12;
  
  if ((*(int *)((long)to._i._M_node + 0x140) == 1) && (*(int *)((long)to._i._M_node + 0x144) == 1))
  {
    if ((*(int *)((long)from._i._M_node + 0x140) == 1) &&
       (*(int *)((long)from._i._M_node + 0x144) == 1)) {
      if (((*(byte *)((long)from._i._M_node + 0x150) & 1) == 0) &&
         ((*(byte *)((long)from._i._M_node + 0x151) & 1) != 0)) {
        if (*(int *)((long)to._i._M_node + 0x120) == *(int *)((long)from._i._M_node + 0x120)) {
          lVar2 = *(long *)((long)to._i._M_node + 0x128);
          lVar3 = *(long *)((long)to._i._M_node + 0x130);
          lVar4 = *(long *)((long)to._i._M_node + 0x138);
          bVar1 = *(byte *)((long)to._i._M_node + 0x151);
          lVar5 = *(long *)((long)from._i._M_node + 0x130);
          lVar6 = *(long *)((long)from._i._M_node + 0x138);
          if ((lVar5 == 2) || (lVar5 == 4)) {
            if (scanline1 <= scanline2) {
              lVar9 = (long)xStart;
              lVar11 = 0;
              if ((*(byte *)((long)to._i._M_node + 0x150) & 1) == 0) {
                lVar11 = lVar3 * lVar9;
              }
              lVar7 = (long)scanline1;
              lVar8 = (lVar7 - yStart) * lVar6;
              lVar12 = lVar9 * 4 + lVar8 + *(long *)((long)from._i._M_node + 0x128);
              lVar9 = lVar9 * 2 + lVar8 + *(long *)((long)from._i._M_node + 0x128);
              do {
                lVar8 = lVar7;
                if ((bVar1 & 1) != 0) {
                  lVar8 = lVar7 - yStart;
                }
                puVar10 = (undefined4 *)(lVar8 * lVar4 + lVar2 + lVar11);
                if (lVar5 == 2) {
                  if (0 < width) {
                    lVar8 = 0;
                    do {
                      *(undefined2 *)puVar10 = *(undefined2 *)(lVar9 + lVar8 * 2);
                      puVar10 = (undefined4 *)((long)puVar10 + lVar3);
                      lVar8 = lVar8 + 1;
                    } while (width != (int)lVar8);
                  }
                }
                else if (0 < width) {
                  lVar8 = 0;
                  do {
                    *puVar10 = *(undefined4 *)(lVar12 + lVar8 * 4);
                    puVar10 = (undefined4 *)((long)puVar10 + lVar3);
                    lVar8 = lVar8 + 1;
                  } while (width != (int)lVar8);
                }
                lVar7 = lVar7 + 1;
                lVar12 = lVar12 + lVar6;
                lVar9 = lVar9 + lVar6;
              } while (scanline2 + 1 != (int)lVar7);
            }
            return;
          }
          this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(this_00,"Unhandled type in copying tile cache slice.");
        }
        else {
          this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(this_00,"Invalid type mismatch in slice from setFrameBuffer.");
        }
      }
      else {
        this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc
                  (this_00,"Invalid expectation around tile coords flags from setFrameBuffer.");
      }
    }
    else {
      this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(this_00,"Tiled data should not have subsampling.");
    }
  }
  else {
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this_00,"Tiled data should not have subsampling.");
  }
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
InputFile::Data::copyCachedBuffer (FrameBuffer::ConstIterator to,
                                   FrameBuffer::ConstIterator from,
                                   int scanline1, int scanline2,
                                   int yStart, int xStart, int width)
{
    Slice toSlice = to.slice ();
    if (toSlice.xSampling != 1 || toSlice.ySampling != 1)
        throw IEX_NAMESPACE::ArgExc ("Tiled data should not have subsampling.");
    Slice fromSlice = from.slice ();
    if (fromSlice.xSampling != 1 || fromSlice.ySampling != 1)
        throw IEX_NAMESPACE::ArgExc ("Tiled data should not have subsampling.");
    if (fromSlice.xTileCoords || !fromSlice.yTileCoords)
        throw IEX_NAMESPACE::ArgExc ("Invalid expectation around tile coords flags from setFrameBuffer.");

    if (toSlice.type != fromSlice.type)
        throw IEX_NAMESPACE::ArgExc ("Invalid type mismatch in slice from setFrameBuffer.");
    if (fromSlice.xStride != 2 && fromSlice.xStride != 4)
        throw IEX_NAMESPACE::ArgExc ("Unhandled type in copying tile cache slice.");

    for (int y = scanline1; y <= scanline2; ++y)
    {
        char* toPtr = toSlice.base;
        const char* fromPtr = fromSlice.base;

        if (toSlice.yTileCoords)
            toPtr += ( int64_t (y) - int64_t (yStart) ) * toSlice.yStride;
        else
            toPtr += int64_t (y) * toSlice.yStride;
        if (!toSlice.xTileCoords)
            toPtr += int64_t (xStart) * toSlice.xStride;

        fromPtr += ( int64_t (y) - int64_t (yStart) ) * fromSlice.yStride;
        if (fromSlice.xStride == 2)
        {
            fromPtr += int64_t (xStart) * 2;
            for (int x = 0; x < width; ++x)
            {
                *reinterpret_cast<uint16_t*> (toPtr) =
                    *reinterpret_cast<const uint16_t*> (fromPtr);
                toPtr += toSlice.xStride;
                fromPtr += 2;
            }
        }
        else
        {
            fromPtr += int64_t (xStart) * 4;
            for (int x = 0; x < width; ++x)
            {
                *reinterpret_cast<uint32_t*> (toPtr) =
                    *reinterpret_cast<const uint32_t*> (fromPtr);
                toPtr += toSlice.xStride;
                fromPtr += 4;
            }
        }
    }
}